

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManDivCreate(Fxch_Man_t *pFxchMan)

{
  size_t __size;
  int *piVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  Vec_Que_t *pVVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  Vec_Flt_t *pVVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  
  for (iVar8 = 0; iVar8 < pFxchMan->vCubes->nSize; iVar8 = iVar8 + 1) {
    Vec_WecEntry(pFxchMan->vCubes,iVar8);
    Fxch_ManDivSingleCube(pFxchMan,iVar8,1,0);
    Fxch_ManDivDoubleCube(pFxchMan,iVar8,1,0);
  }
  pVVar11 = pFxchMan->vDivWeights;
  uVar9 = pVVar11->nSize;
  pVVar5 = (Vec_Que_t *)calloc(1,0x20);
  uVar6 = 0x10;
  if (0x10 < (int)uVar9) {
    uVar6 = (ulong)uVar9;
  }
  pVVar5->nSize = 1;
  pVVar5->nCap = (int)uVar6 + 1;
  __size = uVar6 * 4 + 4;
  piVar7 = (int *)malloc(__size);
  memset(piVar7,0xff,__size);
  pVVar5->pHeap = piVar7;
  piVar7 = (int *)malloc(__size);
  memset(piVar7,0xff,__size);
  pVVar5->pOrder = piVar7;
  pFxchMan->vDivPrio = pVVar5;
  pVVar5->pCostsFlt = &pVVar11->pArray;
  uVar6 = 0;
  do {
    if ((long)(int)uVar9 <= (long)uVar6) {
      return;
    }
    if (0.0 < pVVar11->pArray[uVar6]) {
      pVVar5 = pFxchMan->vDivPrio;
      iVar8 = pVVar5->nCap;
      if (iVar8 <= pVVar5->nSize) {
        iVar3 = pVVar5->nSize + 1;
        iVar12 = iVar8 * 2;
        if (iVar8 * 2 < iVar3) {
          iVar12 = iVar3;
        }
        Vec_QueGrow(pVVar5,iVar12);
        iVar8 = pVVar5->nCap;
      }
      iVar12 = (int)uVar6;
      if ((long)iVar8 <= (long)uVar6) {
        iVar3 = iVar8 * 2;
        iVar4 = iVar12 + 1;
        if (iVar4 != iVar3 && SBORROW4(iVar4,iVar3) == iVar4 + iVar8 * -2 < 0) {
          iVar3 = iVar4;
        }
        Vec_QueGrow(pVVar5,iVar3);
        iVar8 = pVVar5->nCap;
      }
      iVar3 = pVVar5->nSize;
      if (iVar8 <= iVar3) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar7 = pVVar5->pOrder;
      if (piVar7[uVar6] != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar1 = pVVar5->pHeap;
      if (piVar1[iVar3] != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      piVar7[uVar6] = iVar3;
      iVar8 = pVVar5->nSize;
      pVVar5->nSize = iVar8 + 1;
      piVar1[iVar8] = iVar12;
      pfVar2 = *pVVar5->pCostsFlt;
      if (pfVar2 == (float *)0x0) {
        fVar13 = (float)iVar12;
      }
      else {
        fVar13 = pfVar2[uVar6];
      }
      uVar10 = (ulong)piVar7[uVar6];
      if (uVar10 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (uVar6 != (uint)piVar1[uVar10]) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      while (iVar8 = (int)uVar10, 1 < iVar8) {
        iVar3 = piVar1[(uint)(iVar8 >> 1)];
        if (pfVar2 == (float *)0x0) {
          fVar14 = (float)iVar3;
        }
        else {
          fVar14 = pfVar2[iVar3];
        }
        if (fVar13 <= fVar14) break;
        piVar1[uVar10 & 0xffffffff] = iVar3;
        piVar7[iVar3] = iVar8;
        uVar10 = (ulong)(uint)(iVar8 >> 1);
      }
      piVar1[iVar8] = iVar12;
      piVar7[uVar6] = iVar8;
      pVVar11 = pFxchMan->vDivWeights;
      uVar9 = pVVar11->nSize;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Fxch_ManDivCreate( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    float Weight;
    int fAdd = 1,
        fUpdate = 0,
        iCube;

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube, fAdd, fUpdate );
        Fxch_ManDivDoubleCube( pFxchMan, iCube, fAdd, fUpdate );
    }

    pFxchMan->vDivPrio = Vec_QueAlloc( Vec_FltSize( pFxchMan->vDivWeights ) );
    Vec_QueSetPriority( pFxchMan->vDivPrio, Vec_FltArrayP( pFxchMan->vDivWeights ) );
    Vec_FltForEachEntry( pFxchMan->vDivWeights, Weight, iCube )
    {
        if ( Weight > 0.0 )
            Vec_QuePush( pFxchMan->vDivPrio, iCube );
    }
}